

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Worker.cpp
# Opt level: O2

void __thiscall adios2::query::Worker::Worker(Worker *this,string *queryFile,Engine *adiosEngine)

{
  this->_vptr_Worker = (_func_int **)&PTR__Worker_00823088;
  std::__cxx11::string::string((string *)&this->m_QueryFile,(string *)queryFile);
  this->m_SourceReader = adiosEngine;
  this->m_Query = (QueryBase *)0x0;
  return;
}

Assistant:

Worker::Worker(const std::string &queryFile, adios2::core::Engine *adiosEngine)
: m_QueryFile(queryFile), m_SourceReader(adiosEngine)
{
}